

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O0

void __thiscall xray_re::xr_mesh_builder::remove_empty_surfmaps(xr_mesh_builder *this)

{
  xr_surfmap *pxVar1;
  bool bVar2;
  reference ppxVar3;
  __normal_iterator<xray_re::xr_surfmap_**,_std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>_>
  local_48;
  const_iterator local_40;
  const_iterator local_38;
  xr_surfmap *local_30;
  xr_surfmap *smap;
  xr_surfmap_vec_it end;
  xr_surfmap_vec_it it;
  xr_surfmap_vec_it last;
  xr_mesh_builder *this_local;
  
  end._M_current =
       (xr_surfmap **)
       std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>::begin
                 (&(this->super_xr_mesh).m_surfmaps);
  it._M_current = end._M_current;
  smap = (xr_surfmap *)
         std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>::end
                   (&(this->super_xr_mesh).m_surfmaps);
  while (bVar2 = __gnu_cxx::operator!=
                           (&end,(__normal_iterator<xray_re::xr_surfmap_**,_std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>_>
                                  *)&smap), bVar2) {
    ppxVar3 = __gnu_cxx::
              __normal_iterator<xray_re::xr_surfmap_**,_std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>_>
              ::operator*(&end);
    local_30 = *ppxVar3;
    bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&local_30->faces);
    pxVar1 = local_30;
    if (bVar2) {
      if (local_30 != (xr_surfmap *)0x0) {
        xr_surfmap::~xr_surfmap(local_30);
        operator_delete(pxVar1,0x20);
      }
    }
    else {
      bVar2 = __gnu_cxx::operator!=(&end,&it);
      pxVar1 = local_30;
      if (bVar2) {
        ppxVar3 = __gnu_cxx::
                  __normal_iterator<xray_re::xr_surfmap_**,_std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>_>
                  ::operator*(&it);
        *ppxVar3 = pxVar1;
      }
      __gnu_cxx::
      __normal_iterator<xray_re::xr_surfmap_**,_std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>_>
      ::operator++(&it);
    }
    __gnu_cxx::
    __normal_iterator<xray_re::xr_surfmap_**,_std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>_>
    ::operator++(&end);
  }
  __gnu_cxx::
  __normal_iterator<xray_re::xr_surfmap*const*,std::vector<xray_re::xr_surfmap*,std::allocator<xray_re::xr_surfmap*>>>
  ::__normal_iterator<xray_re::xr_surfmap**>
            ((__normal_iterator<xray_re::xr_surfmap*const*,std::vector<xray_re::xr_surfmap*,std::allocator<xray_re::xr_surfmap*>>>
              *)&local_38,&it);
  local_48._M_current =
       (xr_surfmap **)
       std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>::end
                 (&(this->super_xr_mesh).m_surfmaps);
  __gnu_cxx::
  __normal_iterator<xray_re::xr_surfmap*const*,std::vector<xray_re::xr_surfmap*,std::allocator<xray_re::xr_surfmap*>>>
  ::__normal_iterator<xray_re::xr_surfmap**>
            ((__normal_iterator<xray_re::xr_surfmap*const*,std::vector<xray_re::xr_surfmap*,std::allocator<xray_re::xr_surfmap*>>>
              *)&local_40,&local_48);
  std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>::erase
            (&(this->super_xr_mesh).m_surfmaps,local_38,local_40);
  return;
}

Assistant:

void xr_mesh_builder::remove_empty_surfmaps()
{
	xr_surfmap_vec_it last = m_surfmaps.begin();
	for (xr_surfmap_vec_it it = last, end = m_surfmaps.end(); it != end; ++it) {
		xr_surfmap* smap = *it;
		if (smap->faces.empty()) {
			delete smap;
			continue;
		}
		if (it != last)
			*last = smap;
		++last;
	}
	m_surfmaps.erase(last, m_surfmaps.end());
}